

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O2

UBool isAliasInList(char *alias,uint32_t listOffset)

{
  ushort *puVar1;
  uint16_t *puVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  puVar2 = gMainTable.stringTable;
  puVar1 = gMainTable.taggedAliasLists + listOffset;
  uVar6 = (ulong)*puVar1;
  for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    uVar4 = (ulong)puVar1[uVar5 + 1];
    if (uVar4 != 0) {
      iVar3 = ucnv_compareNames_63(alias,(char *)(puVar2 + uVar4));
      if (iVar3 == 0) break;
    }
  }
  return uVar5 < uVar6;
}

Assistant:

static inline UBool
isAliasInList(const char *alias, uint32_t listOffset) {
    if (listOffset) {
        uint32_t currAlias;
        uint32_t listCount = gMainTable.taggedAliasLists[listOffset];
        /* +1 to skip listCount */
        const uint16_t *currList = gMainTable.taggedAliasLists + listOffset + 1;
        for (currAlias = 0; currAlias < listCount; currAlias++) {
            if (currList[currAlias]
                && ucnv_compareNames(alias, GET_STRING(currList[currAlias]))==0)
            {
                return TRUE;
            }
        }
    }
    return FALSE;
}